

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

bool IsConfSupported(KeyInfo *key,string *error)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  LogFlags unaff_retaddr;
  int in_stack_0000000c;
  ConstevalFormatString<0U> in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  undefined1 in_stack_00000060 [16];
  Level in_stack_00000140;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::operator==(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    local_29 = false;
  }
  else {
    bVar2 = std::operator==(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      LogPrintFormatInternal<>
                ((string_view)in_stack_00000060,(string_view)in_stack_00000050,in_stack_0000000c,
                 unaff_retaddr,in_stack_00000140,in_stack_00000048);
      local_29 = true;
    }
    else {
      local_29 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool IsConfSupported(KeyInfo& key, std::string& error) {
    if (key.name == "conf") {
        error = "conf cannot be set in the configuration file; use includeconf= if you want to include additional config files";
        return false;
    }
    if (key.name == "reindex") {
        // reindex can be set in a config file but it is strongly discouraged as this will cause the node to reindex on
        // every restart. Allow the config but throw a warning
        LogPrintf("Warning: reindex=1 is set in the configuration file, which will significantly slow down startup. Consider removing or commenting out this option for better performance, unless there is currently a condition which makes rebuilding the indexes necessary\n");
        return true;
    }
    return true;
}